

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_ExpressionMacro_x_iutest_x_True_Test::Body(iu_ExpressionMacro_x_iutest_x_True_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TestFlag TVar5;
  TestPartResultReporterInterface *pTVar6;
  int iVar7;
  TestFlag *pTVar8;
  Variable *pVVar9;
  char *in_R9;
  ScopedSPITestFlag guard_1;
  size_type __dnew;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  ScopedSPITestFlag guard;
  AssertionResult iutest_spi_ar_1;
  TestFlag local_34c;
  AssertionHelper local_348;
  undefined1 local_318 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  long *local_2f0 [2];
  long local_2e0 [2];
  char local_2d0;
  _Alloc_hider local_2c8;
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [24];
  SPIFailureChecker local_2a0;
  int local_268 [4];
  AssertionResult local_258;
  AssertionResult local_230;
  ExpressionResult local_208;
  ExpressionLHS<int> local_1e0;
  undefined1 local_1b8 [8];
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  bool local_198;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a0.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_258);
  local_208.m_result.m_message._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)local_318,(int *)&local_208);
  local_1e0.m_lhs = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_348,(ExpressionLHS<int> *)local_318,&local_1e0.m_lhs);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_348);
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,local_1b8,(char *)((long)local_1b8 + local_1b0));
  local_2d0 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._8_8_ != &local_300) {
    operator_delete((void *)local_318._8_8_,local_300._M_allocated_capacity + 1);
  }
  if (local_2d0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_318,(internal *)local_2f0,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42)","false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,(char *)local_318._0_8_,(allocator<char> *)&local_208);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xed;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  iVar7 = (int)local_258.m_message._M_dataplus._M_p;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = iVar7;
  local_1a8._M_allocated_capacity = 0x3234203d21203234;
  local_1b0 = 8;
  local_1a8._M_local_buf[8] = '\0';
  local_1b8 = (undefined1  [8])&local_1a8;
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&local_2c8,&local_2a0,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if ((bool)local_2b8[0x10] == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,local_2c8._M_p,(allocator<char> *)&local_348);
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000ed;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a0,(Fixed *)local_1b8,false);
    if (local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a0.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2c8._M_p != local_2b8) {
    operator_delete(local_2c8._M_p,local_2b8._0_8_ + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a0.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_34c);
  local_268[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&local_2c8,local_268 + 3);
  local_268[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_318,(ExpressionLHS<int> *)&local_2c8,local_268 + 2);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_348,(ExpressionResult *)local_318);
  local_268[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_1e0,local_268 + 1);
  local_268[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator!=(&local_208,&local_1e0,local_268);
  iutest::detail::ExpressionResult::GetResult(&local_258,&local_208);
  iutest::AssertionResult::operator&&
            ((AssertionResult *)local_1b8,(AssertionResult *)&local_348,&local_258);
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,local_1b8,(char *)((long)local_1b8 + local_1b0));
  local_2d0 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  paVar1 = &local_258.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                  (int)local_258.m_message._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                             (int)local_258.m_message._M_dataplus._M_p),
                    local_258.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_208.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_208.m_result.m_message._M_dataplus._M_p._4_4_,
                  local_208.m_result.m_message._M_dataplus._M_p._0_4_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_208.m_result.m_message._M_dataplus._M_p._4_4_,
                             local_208.m_result.m_message._M_dataplus._M_p._0_4_),
                    local_208.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_1e0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (local_2c0._M_p != local_2b8 + 8) {
    operator_delete(local_2c0._M_p,local_2b8._8_8_ + 1);
  }
  if (local_2d0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_318,(internal *)local_2f0,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) && IUTEST_EXPRESSION(f() != 10)",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,(char *)local_318._0_8_,(allocator<char> *)&local_2c8);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xee;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  TVar5.m_test_flags = local_34c.m_test_flags;
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = TVar5.m_test_flags;
  local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x14;
  local_1b8 = (undefined1  [8])&local_1a8;
  local_1b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_348)
  ;
  local_1a8._M_allocated_capacity =
       (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8 = 0x3234203d21203234;
  *(char *)((long)local_1b8 + 8) = ' ';
  *(char *)((long)local_1b8 + 9) = '&';
  *(char *)((long)local_1b8 + 10) = '&';
  *(char *)((long)local_1b8 + 0xb) = ' ';
  *(char *)((long)local_1b8 + 0xc) = '4';
  *(char *)((long)local_1b8 + 0xd) = '2';
  *(char *)((long)local_1b8 + 0xe) = ' ';
  *(char *)((long)local_1b8 + 0xf) = '!';
  *(char *)((long)local_1b8 + 0x10) = '=';
  *(char *)((long)local_1b8 + 0x11) = ' ';
  *(char *)((long)local_1b8 + 0x12) = '1';
  *(char *)((long)local_1b8 + 0x13) = '0';
  local_1b0 = (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)((long)local_1b8 +
           (long)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_230,&local_2a0,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_348);
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000ee;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a0,(Fixed *)local_1b8,false);
    if (local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a0.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar4 = &local_230.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_2a0.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_34c);
  local_268[3] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)&local_2c8,local_268 + 3);
  local_268[2] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)local_318,(ExpressionLHS<int> *)&local_2c8,local_268 + 2);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_348,(ExpressionResult *)local_318);
  local_268[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS(&local_1e0,local_268 + 1);
  local_268[0] = 10;
  iutest::detail::ExpressionLHS<int>::operator==(&local_208,&local_1e0,local_268);
  iutest::detail::ExpressionResult::GetResult(&local_258,&local_208);
  iutest::AssertionResult::operator||
            ((AssertionResult *)local_1b8,(AssertionResult *)&local_348,&local_258);
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2f0,local_1b8,(pointer)(local_1b0 + (long)local_1b8));
  local_2d0 = local_198;
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                  (int)local_258.m_message._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_258.m_message._M_dataplus._M_p._4_4_,
                             (int)local_258.m_message._M_dataplus._M_p),
                    local_258.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_208.m_result.m_message._M_dataplus._M_p._4_4_,
                  local_208.m_result.m_message._M_dataplus._M_p._0_4_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_208.m_result.m_message._M_dataplus._M_p._4_4_,
                             local_208.m_result.m_message._M_dataplus._M_p._0_4_),
                    local_208.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if (local_2c0._M_p != local_2b8 + 8) {
    operator_delete(local_2c0._M_p,local_2b8._8_8_ + 1);
  }
  if (local_2d0 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_318,(internal *)local_2f0,
               (AssertionResult *)"IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 10)",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,(char *)local_318._0_8_,(allocator<char> *)&local_2c8);
    local_348.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_348.m_part_result.super_iuCodeMessage.m_line = 0xef;
    local_348.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_348,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_348.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_348.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_318._0_8_ != local_318 + 0x10) {
      operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_2f0[0] != local_2e0) {
    operator_delete(local_2f0[0],local_2e0[0] + 1);
  }
  pTVar8 = iutest::TestFlag::GetInstance();
  pTVar8->m_test_flags = local_34c.m_test_flags;
  local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x14;
  local_1b8 = (undefined1  [8])&local_1a8;
  local_1b8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_348)
  ;
  local_1a8._M_allocated_capacity =
       (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8 = 0x3234203d21203234;
  *(char *)((long)local_1b8 + 8) = ' ';
  *(char *)((long)local_1b8 + 9) = '|';
  *(char *)((long)local_1b8 + 10) = '|';
  *(char *)((long)local_1b8 + 0xb) = ' ';
  *(char *)((long)local_1b8 + 0xc) = '4';
  *(char *)((long)local_1b8 + 0xd) = '2';
  *(char *)((long)local_1b8 + 0xe) = ' ';
  *(char *)((long)local_1b8 + 0xf) = '=';
  *(char *)((long)local_1b8 + 0x10) = '=';
  *(char *)((long)local_1b8 + 0x11) = ' ';
  *(char *)((long)local_1b8 + 0x12) = '1';
  *(char *)((long)local_1b8 + 0x13) = '0';
  local_1b0 = (size_type)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)((long)local_1b8 +
           (long)local_348.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_230,&local_2a0,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar6 = local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar9 = iutest::TestEnv::get_vars();
  pVVar9->m_testpartresult_reporter = pTVar6;
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,local_230.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_348);
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000ef;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_2a0,(Fixed *)local_1b8,false);
    if (local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_2a0.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_2a0.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar4) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ExpressionMacro, True)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42)), "42 != 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42) && IUTEST_EXPRESSION(f() != 10)), "42 != 42 && 42 != 10");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_TRUE(IUTEST_EXPRESSION(f() != 42) || IUTEST_EXPRESSION(f() == 10)), "42 != 42 || 42 == 10");
}